

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserInputBufferCreateMem(void)

{
  int iVar1;
  xmlCharEncoding val;
  xmlCharEncoding xVar2;
  int iVar3;
  char *val_00;
  xmlParserInputBufferPtr val_01;
  int local_34;
  int n_enc;
  xmlCharEncoding enc;
  int n_size;
  int size;
  int n_mem;
  char *mem;
  xmlParserInputBufferPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_size = 0; n_size < 4; n_size = n_size + 1) {
    for (n_enc = 0; n_enc < 4; n_enc = n_enc + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_const_char_ptr(n_size,0);
        enc = gen_int(n_enc,1);
        val = gen_xmlCharEncoding(local_34,2);
        if (val_00 != (char *)0x0) {
          xVar2 = xmlStrlen(val_00);
          if (xVar2 < enc) {
            enc = XML_CHAR_ENCODING_NONE;
          }
        }
        val_01 = (xmlParserInputBufferPtr)xmlParserInputBufferCreateMem(val_00,enc,val);
        desret_xmlParserInputBufferPtr(val_01);
        call_tests = call_tests + 1;
        des_const_char_ptr(n_size,val_00,0);
        des_int(n_enc,enc,1);
        des_xmlCharEncoding(local_34,val,2);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar1 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
                 (ulong)(uint)(iVar3 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)(uint)n_size);
          printf(" %d",(ulong)(uint)n_enc);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlParserInputBufferCreateMem(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputBufferPtr ret_val;
    const char * mem; /* the memory input */
    int n_mem;
    int size; /* the length of the memory block */
    int n_size;
    xmlCharEncoding enc; /* the charset encoding if known (deprecated) */
    int n_enc;

    for (n_mem = 0;n_mem < gen_nb_const_char_ptr;n_mem++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        mem_base = xmlMemBlocks();
        mem = gen_const_char_ptr(n_mem, 0);
        size = gen_int(n_size, 1);
        enc = gen_xmlCharEncoding(n_enc, 2);
        if ((mem != NULL) &&
            (size > xmlStrlen(BAD_CAST mem)))
            size = 0;

        ret_val = xmlParserInputBufferCreateMem(mem, size, enc);
        desret_xmlParserInputBufferPtr(ret_val);
        call_tests++;
        des_const_char_ptr(n_mem, mem, 0);
        des_int(n_size, size, 1);
        des_xmlCharEncoding(n_enc, enc, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_mem);
            printf(" %d", n_size);
            printf(" %d", n_enc);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}